

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffload.c
# Opt level: O0

FT_Byte cff_fd_select_get(CFF_FDSelect fdselect,FT_UInt glyph_index)

{
  FT_Byte FVar1;
  FT_Byte *pFVar2;
  uint uVar3;
  FT_Byte *pFVar4;
  uint local_30;
  FT_UInt limit;
  FT_UInt first;
  FT_Byte fd2;
  FT_Byte *p_limit;
  FT_Byte *p;
  FT_Byte fd;
  FT_UInt glyph_index_local;
  CFF_FDSelect fdselect_local;
  
  p._3_1_ = '\0';
  if (fdselect->data != (FT_Byte *)0x0) {
    if (fdselect->format == '\0') {
      p._3_1_ = fdselect->data[glyph_index];
    }
    else if (fdselect->format == '\x03') {
      if (glyph_index - fdselect->cache_first < fdselect->cache_count) {
        p._3_1_ = fdselect->cache_fd;
      }
      else {
        pFVar2 = fdselect->data;
        local_30 = (uint)CONCAT11(*pFVar2,pFVar2[1]);
        p_limit = pFVar2 + 2;
        do {
          if (glyph_index < local_30) {
            return '\0';
          }
          FVar1 = *p_limit;
          pFVar4 = p_limit + 3;
          uVar3 = (uint)CONCAT11(p_limit[1],p_limit[2]);
          if (glyph_index < uVar3) {
            fdselect->cache_first = local_30;
            fdselect->cache_count = uVar3 - local_30;
            fdselect->cache_fd = FVar1;
            return FVar1;
          }
          local_30 = uVar3;
          p_limit = pFVar4;
        } while (pFVar4 < pFVar2 + fdselect->data_size);
      }
    }
  }
  return p._3_1_;
}

Assistant:

FT_LOCAL_DEF( FT_Byte )
  cff_fd_select_get( CFF_FDSelect  fdselect,
                     FT_UInt       glyph_index )
  {
    FT_Byte  fd = 0;


    /* if there is no FDSelect, return zero               */
    /* Note: CFF2 with just one Font Dict has no FDSelect */
    if ( !fdselect->data )
      goto Exit;

    switch ( fdselect->format )
    {
    case 0:
      fd = fdselect->data[glyph_index];
      break;

    case 3:
      /* first, compare to the cache */
      if ( (FT_UInt)( glyph_index - fdselect->cache_first ) <
                        fdselect->cache_count )
      {
        fd = fdselect->cache_fd;
        break;
      }

      /* then, look up the ranges array */
      {
        FT_Byte*  p       = fdselect->data;
        FT_Byte*  p_limit = p + fdselect->data_size;
        FT_Byte   fd2;
        FT_UInt   first, limit;


        first = FT_NEXT_USHORT( p );
        do
        {
          if ( glyph_index < first )
            break;

          fd2   = *p++;
          limit = FT_NEXT_USHORT( p );

          if ( glyph_index < limit )
          {
            fd = fd2;

            /* update cache */
            fdselect->cache_first = first;
            fdselect->cache_count = limit - first;
            fdselect->cache_fd    = fd2;
            break;
          }
          first = limit;

        } while ( p < p_limit );
      }
      break;

    default:
      ;
    }

  Exit:
    return fd;
  }